

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

void __thiscall cmState::SetCacheEntryValue(cmState *this,string *key,string *value)

{
  CacheIterator local_18;
  
  local_18 = cmCacheManager::GetCacheIterator
                       ((this->CacheManager)._M_t.
                        super___uniq_ptr_impl<cmCacheManager,_std::default_delete<cmCacheManager>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_cmCacheManager_*,_std::default_delete<cmCacheManager>_>
                        .super__Head_base<0UL,_cmCacheManager_*,_false>._M_head_impl,
                        (key->_M_dataplus)._M_p);
  cmCacheManager::CacheIterator::SetValue(&local_18,(value->_M_dataplus)._M_p);
  return;
}

Assistant:

void cmState::SetCacheEntryValue(std::string const& key,
                                 std::string const& value)
{
  this->CacheManager->SetCacheEntryValue(key, value);
}